

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::STX_ZP(CPU *this)

{
  uint uVar1;
  
  this->cycles = 3;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uVar1 & 0xff),(ulong)this->X);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::STX_ZP()
{
    cycles = 3;
    WriteByte(GetByte(), X);
}